

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.hpp
# Opt level: O0

bool diy::Factory<diy::Link>::Registrar<diy::RegularLink<diy::Bounds<double>_>_>::registerT(void)

{
  _func_Link_ptr *p_Var1;
  mapped_type *pp_Var2;
  char *name;
  key_type *in_stack_ffffffffffffff88;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_diy::Link_*(*)(),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_diy::Link_*(*)()>_>_>
  *in_stack_ffffffffffffff90;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  _lambda___1_ local_9;
  char *local_8;
  
  local_8 = std::type_info::name((type_info *)&RegularLink<diy::Bounds<double>>::typeinfo);
  p_Var1 = diy::Factory::Registrar::registerT()::{lambda()#1}::operator_cast_to_function_pointer
                     (&local_9);
  data_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pp_Var2 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_diy::Link_*(*)(),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_diy::Link_*(*)()>_>_>
            ::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *pp_Var2 = p_Var1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  return true;
}

Assistant:

static bool registerT()
            {
                const auto name = typeid(T).name();
                Factory::data()[name] = [](Args... args) -> Base*
                {
                    return new T(std::forward<Args>(args)...);
                };
                return true;
            }